

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementBackgroundBorder.cpp
# Opt level: O3

Background * __thiscall
Rml::ElementBackgroundBorder::GetOrCreateBackground
          (ElementBackgroundBorder *this,BackgroundType type)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  key_type local_4;
  
  p_Var4 = (this->backgrounds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->backgrounds)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var1->_M_header;
    do {
      if ((int)type <= (int)p_Var4[1]._M_color) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < (int)type];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var1) && ((int)p_Var2[1]._M_color <= (int)type)) {
      return (Background *)&p_Var2[1]._M_parent;
    }
  }
  pmVar3 = ::std::
           map<Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background,_std::less<Rml::ElementBackgroundBorder::BackgroundType>,_std::allocator<std::pair<const_Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background>_>_>
           ::operator[](&this->backgrounds,&local_4);
  return pmVar3;
}

Assistant:

ElementBackgroundBorder::Background& ElementBackgroundBorder::GetOrCreateBackground(BackgroundType type)
{
	auto it = backgrounds.find(type);
	if (it != backgrounds.end())
		return it->second;

	Background& background = backgrounds[type];
	return background;
}